

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_1::generateShuffledRamp
               (int numElements,vector<int,_std::allocator<int>_> *ramp)

{
  pointer piVar1;
  undefined1 auVar2 [16];
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  Random rng;
  deRandom dStack_28;
  
  deRandom_init(&dStack_28,0xabcd);
  std::vector<int,_std::allocator<int>_>::resize(ramp,(long)numElements);
  auVar2 = _DAT_00942940;
  if (0 < numElements) {
    piVar1 = (ramp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    lVar3 = (ulong)(uint)numElements - 1;
    auVar4._8_4_ = (int)lVar3;
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = (int)((ulong)lVar3 >> 0x20);
    lVar3 = 0;
    auVar4 = auVar4 ^ _DAT_00942940;
    auVar5 = _DAT_00942880;
    do {
      auVar6 = auVar5 ^ auVar2;
      lVar7 = auVar5._8_8_;
      if ((bool)(~(auVar6._4_4_ == auVar4._4_4_ && auVar4._0_4_ < auVar6._0_4_ ||
                  auVar4._4_4_ < auVar6._4_4_) & 1)) {
        *(int *)((long)piVar1 + lVar3) = (int)(auVar5._0_8_ + 1);
      }
      if ((auVar6._12_4_ != auVar4._12_4_ || auVar6._8_4_ <= auVar4._8_4_) &&
          auVar6._12_4_ <= auVar4._12_4_) {
        *(int *)((long)piVar1 + lVar3 + 4) = (int)(lVar7 + 1);
      }
      auVar5._0_8_ = auVar5._0_8_ + 2;
      auVar5._8_8_ = lVar7 + 2;
      lVar3 = lVar3 + 8;
    } while ((ulong)(numElements + 1U >> 1) << 3 != lVar3);
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)&dStack_28,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (ramp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      (ramp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void generateShuffledRamp (int numElements, std::vector<int>& ramp)
{
	de::Random rng(0xabcd);

	// some positive (non-zero) unique values
	ramp.resize(numElements);
	for (int callNdx = 0; callNdx < numElements; ++callNdx)
		ramp[callNdx] = callNdx + 1;

	rng.shuffle(ramp.begin(), ramp.end());
}